

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
mocker::anon_unknown_5::FindUnusedVariables::operator()(FindUnusedVariables *this,NewExpr *node)

{
  __shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *__r;
  long *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  p_Var1 = &((node->providedDims).
             super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
  for (__r = &((node->providedDims).
               super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>; __r != p_Var1
      ; __r = __r + 1) {
    if (__r->_M_ptr != (element_type *)0x0) {
      std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ast::Expression,void>
                ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_38,__r);
      (**(code **)(*local_38 + 0x18))(local_38,this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    }
  }
  return;
}

Assistant:

void operator()(const ast::NewExpr &node) const override {
    for (auto &dim : node.providedDims)
      if (dim)
        visit(dim);
  }